

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O3

void genNames(char *prefix,int index,string *textures_dir,string *material,string *image,
             string *image_file)

{
  size_type *psVar1;
  long lVar2;
  char cVar3;
  uint uVar4;
  size_t sVar5;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  uint __uval;
  uint __val;
  uint uVar9;
  stringstream local_508 [8];
  stringstream s_file;
  ostream local_4f8 [8];
  string local_4f0 [104];
  ios_base aiStack_488 [264];
  stringstream local_380 [8];
  stringstream s_img;
  long local_370;
  string local_368 [104];
  ios_base aiStack_300 [264];
  stringstream local_1f8 [8];
  stringstream s_mat;
  long local_1e8;
  string local_1e0 [8];
  undefined8 auStack_1d8 [12];
  ios_base aiStack_178 [112];
  char acStack_108 [152];
  string *local_70;
  string *local_68;
  string *local_60;
  string *local_58;
  size_type *local_50;
  string __str;
  
  local_70 = textures_dir;
  std::__cxx11::stringstream::stringstream(local_1f8);
  std::__cxx11::stringstream::stringstream(local_380);
  local_68 = material;
  std::__cxx11::stringstream::stringstream(local_508);
  psVar1 = &__str._M_string_length;
  __str._M_dataplus._M_p = (pointer)0x0;
  __str._M_string_length._0_1_ = 0;
  local_50 = psVar1;
  std::__cxx11::stringbuf::str(local_1e0);
  if (local_50 != psVar1) {
    operator_delete(local_50);
  }
  __str._M_dataplus._M_p = (pointer)0x0;
  __str._M_string_length._0_1_ = 0;
  local_50 = psVar1;
  std::__cxx11::stringbuf::str(local_368);
  if (local_50 != psVar1) {
    operator_delete(local_50);
  }
  __str._M_dataplus._M_p = (pointer)0x0;
  __str._M_string_length._0_1_ = 0;
  local_50 = psVar1;
  std::__cxx11::stringbuf::str(local_4f0);
  if (local_50 != psVar1) {
    operator_delete(local_50);
  }
  local_60 = image;
  local_58 = image_file;
  if (prefix == (char *)0x0) {
    std::ios::clear((int)(ostream *)&local_1e8 + (int)*(undefined8 *)(local_1e8 + -0x18));
  }
  else {
    sVar5 = strlen(prefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1e8,prefix,sVar5);
  }
  *(undefined8 *)((long)auStack_1d8 + *(long *)(local_1e8 + -0x18)) = 6;
  lVar2 = *(long *)(local_1e8 + -0x18);
  if (acStack_108[lVar2 + 1] == '\0') {
    std::ios::widen((char)(ostream *)&local_1e8 + (char)lVar2);
    acStack_108[lVar2 + 1] = '\x01';
  }
  acStack_108[lVar2] = '0';
  __val = -index;
  if (0 < index) {
    __val = index;
  }
  uVar9 = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar9 = uVar4;
      uVar7 = (uint)uVar8;
      if (uVar7 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_00103cba;
      }
      if (uVar7 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_00103cba;
      }
      if (uVar7 < 10000) goto LAB_00103cba;
      uVar8 = uVar8 / 10000;
      uVar4 = uVar9 + 4;
    } while (99999 < uVar7);
    uVar9 = uVar9 + 1;
  }
LAB_00103cba:
  cVar3 = (char)(index >> 0x1f);
  local_50 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar9 - cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_50 + (ulong)((uint)index >> 0x1f)),uVar9,__val);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1e8,(char *)local_50,(long)__str._M_dataplus._M_p);
  if (local_50 != &__str._M_string_length) {
    operator_delete(local_50);
  }
  if (prefix == (char *)0x0) {
    std::ios::clear((int)(ostream *)&local_370 + (int)*(undefined8 *)(local_370 + -0x18));
  }
  else {
    sVar5 = strlen(prefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_370,prefix,sVar5);
  }
  uVar9 = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar4 = 4;
    do {
      uVar9 = uVar4;
      uVar7 = (uint)uVar8;
      if (uVar7 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_00103da7;
      }
      if (uVar7 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_00103da7;
      }
      if (uVar7 < 10000) goto LAB_00103da7;
      uVar8 = uVar8 / 10000;
      uVar4 = uVar9 + 4;
    } while (99999 < uVar7);
    uVar9 = uVar9 + 1;
  }
LAB_00103da7:
  local_50 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar9 - cVar3);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)index >> 0x1f) + (long)local_50),uVar9,__val);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&local_370,(char *)local_50,(long)__str._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,".jpg",4);
  if (local_50 != &__str._M_string_length) {
    operator_delete(local_50);
  }
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_4f8,(local_70->_M_dataplus)._M_p,local_70->_M_string_length);
  std::__cxx11::stringbuf::str();
  psVar1 = &__str._M_string_length;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,(char *)local_50,(long)__str._M_dataplus._M_p);
  if (local_50 != psVar1) {
    operator_delete(local_50);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_68,(string *)&local_50);
  if (local_50 != psVar1) {
    operator_delete(local_50);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_60,(string *)&local_50);
  if (local_50 != psVar1) {
    operator_delete(local_50);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_58,(string *)&local_50);
  if (local_50 != psVar1) {
    operator_delete(local_50);
  }
  std::__cxx11::stringstream::~stringstream(local_508);
  std::ios_base::~ios_base(aiStack_488);
  std::__cxx11::stringstream::~stringstream(local_380);
  std::ios_base::~ios_base(aiStack_300);
  std::__cxx11::stringstream::~stringstream(local_1f8);
  std::ios_base::~ios_base(aiStack_178);
  return;
}

Assistant:

void genNames(const char* prefix,
    const int index,
    const std::string & textures_dir,
    std::string & material,
    std::string & image,
    std::string & image_file)
{
    std::stringstream s_mat, s_img, s_file;
    s_mat.str(std::string());
    s_img.str(std::string());
    s_file.str(std::string());
    s_mat << prefix << std::setw(6) << std::setfill('0') << std::to_string(index);
    s_img << prefix << std::to_string(index) << IMG_EXT;
    s_file << textures_dir << s_img.str();

    material = s_mat.str();
    image = s_img.str();
    image_file = s_file.str();
}